

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  uint uVar1;
  bool bVar2;
  BCPos BVar3;
  ulong in_RCX;
  ulong uVar4;
  cTValue *pcVar5;
  
  if ((fn->c).ffid != '\0') {
    return 0xffffffff;
  }
  if (nextframe == (cTValue *)0x0) {
    uVar4 = (ulong)L->cframe & 0xfffffffffffffffc;
    if ((uVar4 == 0) ||
       (in_RCX = (ulong)*(uint *)(uVar4 + 0x1c), *(uint *)(uVar4 + 0x1c) == *(uint *)(uVar4 + 0x18))
       ) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
    }
  }
  else {
    uVar1 = (nextframe->field_2).it;
    in_RCX = (ulong)uVar1;
    if ((uVar1 & 3) == 0) goto LAB_0010ca99;
    if ((uVar1 & 7) == 2) {
      in_RCX = (ulong)*(uint *)((long)nextframe + -4);
      goto LAB_0010ca99;
    }
    in_RCX = (ulong)L->cframe & 0xfffffffffffffffc;
    if (in_RCX != 0) {
      pcVar5 = L->base + -1;
      do {
        while ((-1 < *(int *)(in_RCX + 0x10) ||
               ((cTValue *)((ulong)(uint)-*(int *)(in_RCX + 0x10) + (ulong)(L->stack).ptr32) <=
                pcVar5))) {
          if (pcVar5 < nextframe) {
            in_RCX = (ulong)*(uint *)(in_RCX + 0x1c);
            if (in_RCX == 0) {
              bVar2 = false;
              in_RCX = 0;
            }
            else {
              bVar2 = true;
            }
            goto joined_r0x0010ca93;
          }
          uVar1 = (pcVar5->field_2).it;
          if ((uVar1 & 3) == 1) {
LAB_0010ca6d:
            in_RCX = *(ulong *)(in_RCX + 0x30) & 0xfffffffffffffffc;
LAB_0010ca75:
            pcVar5 = (cTValue *)((long)pcVar5 - (long)(int)(uVar1 & 0xfffffff8));
          }
          else {
            if ((uVar1 & 3) != 0) {
              if (((uVar1 & 7) == 2) && (pcVar5[-1].u32.lo == 1)) goto LAB_0010ca6d;
              goto LAB_0010ca75;
            }
            pcVar5 = pcVar5 + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
          }
          if (in_RCX == 0) goto LAB_0010ca84;
        }
        in_RCX = *(ulong *)(in_RCX + 0x30) & 0xfffffffffffffffc;
      } while (in_RCX != 0);
    }
LAB_0010ca84:
    bVar2 = false;
  }
joined_r0x0010ca93:
  if (!bVar2) {
    return 0xffffffff;
  }
LAB_0010ca99:
  uVar4 = (ulong)(fn->c).pc.ptr32;
  BVar3 = (int)(in_RCX - uVar4 >> 2) - 1;
  if ((*(uint *)(uVar4 - 0x38) < BVar3) &&
     (BVar3 = 0xffffffff, 0xfffffffb < *(byte *)(in_RCX - 4) - 0x4d)) {
    return (BCPos)(*(uint *)(in_RCX - 8) - uVar4 >> 2);
  }
  return BVar3;
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    if (bc_isret(bc_op(ins[-1]))) {
      GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
      pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
    } else {
      pos = NO_BCPOS;  /* Punt in case of stack overflow for stitched trace. */
    }
  }
#endif
  return pos;
}